

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bbr2_sender.cc
# Opt level: O0

bool __thiscall quic::Bbr2Sender::IsPipeSufficientlyFull(Bbr2Sender *this)

{
  QuicByteCount QVar1;
  QuicByteCount QVar2;
  float fVar3;
  QuicByteCount bytes_in_flight;
  Bbr2Sender *this_local;
  
  QVar1 = QuicUnackedPacketMap::bytes_in_flight(this->unacked_packets_);
  if (this->mode_ == STARTUP) {
    QVar2 = GetTargetCongestionWindow(this,1.5);
    this_local._7_1_ = QVar2 <= QVar1;
  }
  else {
    fVar3 = Bbr2NetworkModel::pacing_gain(&this->model_);
    if (fVar3 <= 1.0) {
      QVar2 = GetTargetCongestionWindow(this,1.1);
      this_local._7_1_ = QVar2 <= QVar1;
    }
    else {
      fVar3 = Bbr2NetworkModel::pacing_gain(&this->model_);
      QVar2 = GetTargetCongestionWindow(this,fVar3);
      this_local._7_1_ = QVar2 <= QVar1;
    }
  }
  return this_local._7_1_;
}

Assistant:

bool Bbr2Sender::IsPipeSufficientlyFull() const {
	QuicByteCount bytes_in_flight = unacked_packets_->bytes_in_flight();
  // See if we need more bytes in flight to see more bandwidth.
  if (mode_ == Bbr2Mode::STARTUP) {
    // STARTUP exits if it doesn't observe a 25% bandwidth increase, so the CWND
    // must be more than 25% above the target.
    return bytes_in_flight >= GetTargetCongestionWindow(1.5);
  }
  if (model_.pacing_gain() > 1) {
    // Super-unity PROBE_BW doesn't exit until 1.25 * BDP is achieved.
    return bytes_in_flight >= GetTargetCongestionWindow(model_.pacing_gain());
  }
  // If bytes_in_flight are above the target congestion window, it should be
  // possible to observe the same or more bandwidth if it's available.
  return bytes_in_flight >= GetTargetCongestionWindow(1.1);
}